

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O1

void __thiscall ParserTest_SimpleTerms_Test::TestBody(ParserTest_SimpleTerms_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_Node_*,_false> _Var2;
  Node *pNVar3;
  pointer *__ptr;
  _Head_base<0UL,_Node_*,_false> local_d8;
  string local_d0;
  _Head_base<0UL,_Node_*,_false> local_b0;
  _Head_base<0UL,_Node_*,_false> local_a8;
  _Head_base<0UL,_Node_*,_false> local_a0;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_98;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_78;
  function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> local_58;
  
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"42","");
  local_58.super__Function_base._M_functor._M_unused._M_object = Parser::parseTerm;
  local_58.super__Function_base._M_functor._8_8_ = 0;
  local_58._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_58.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
       ::_M_manager;
  pNVar3 = (Node *)operator_new(0x18);
  (pNVar3->mark_).line = 1;
  (pNVar3->mark_).column = 0;
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_001f4a48;
  pNVar3[1]._vptr_Node = (_func_int **)0x4045000000000000;
  local_a0._M_head_impl = pNVar3;
  setupTest(&local_d0,&local_58,(unique_ptr<Node,_std::default_delete<Node>_> *)&local_a0);
  (*pNVar3->_vptr_Node[1])(pNVar3);
  local_a0._M_head_impl = (Node *)0x0;
  if (local_58.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_58.super__Function_base._M_manager)
              ((_Any_data *)&local_58,(_Any_data *)&local_58,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"12.5","");
  local_78.super__Function_base._M_functor._M_unused._M_object = Parser::parseTerm;
  local_78.super__Function_base._M_functor._8_8_ = 0;
  local_78._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_78.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
       ::_M_manager;
  pNVar3 = (Node *)operator_new(0x18);
  (pNVar3->mark_).line = 1;
  (pNVar3->mark_).column = 0;
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_001f4a48;
  pNVar3[1]._vptr_Node = (_func_int **)0x4029000000000000;
  local_a8._M_head_impl = pNVar3;
  setupTest(&local_d0,&local_78,(unique_ptr<Node,_std::default_delete<Node>_> *)&local_a8);
  (*pNVar3->_vptr_Node[1])(pNVar3);
  local_a8._M_head_impl = (Node *)0x0;
  if (local_78.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_78.super__Function_base._M_manager)
              ((_Any_data *)&local_78,(_Any_data *)&local_78,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  local_d0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"x","");
  local_98.super__Function_base._M_functor._M_unused._M_object = Parser::parseTerm;
  local_98.super__Function_base._M_functor._8_8_ = 0;
  local_98._M_invoker =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
       ::_M_invoke;
  local_98.super__Function_base._M_manager =
       std::
       _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
       ::_M_manager;
  std::make_unique<VariableNode,char_const(&)[2]>((char (*) [2])&local_d8);
  _Var2._M_head_impl = local_d8._M_head_impl;
  local_d8._M_head_impl = (Node *)0x0;
  local_b0._M_head_impl = _Var2._M_head_impl;
  setupTest(&local_d0,&local_98,(unique_ptr<Node,_std::default_delete<Node>_> *)&local_b0);
  if (_Var2._M_head_impl != (Node *)0x0) {
    (*(_Var2._M_head_impl)->_vptr_Node[1])(_Var2._M_head_impl);
  }
  local_b0._M_head_impl = (Node *)0x0;
  if (local_d8._M_head_impl != (Node *)0x0) {
    (*(local_d8._M_head_impl)->_vptr_Node[1])();
  }
  if (local_98.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_98.super__Function_base._M_manager)
              ((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(ParserTest, BinaryExpr)
{
  auto node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(2), 
      BinaryOperator::BinaryAnd, 
      std::make_unique<NumericLiteralNode>(3));
  setupTest("2 & 3", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(5), 
      BinaryOperator::BinaryOr, 
      std::make_unique<NumericLiteralNode>(3));
  setupTest("5 | 3", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<VariableNode>("x"), 
      BinaryOperator::BinaryXor, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("x ^ 2", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(1), 
      BinaryOperator::ShiftLeft, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("1 << 2", &Parser::parseArithmeticExpression, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(1), 
      BinaryOperator::ShiftRight, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("1 >> 2", &Parser::parseArithmeticExpression, std::move(node));
}